

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_endo_split
               (secp256k1_scalar *s1,secp256k1_scalar *s2,secp256k1_ge *p1,secp256k1_ge *p2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  uint uVar49;
  secp256k1_ge *psVar50;
  secp256k1_ge *psVar51;
  ulong uVar52;
  ulong uVar53;
  byte bVar54;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_scalar tmp;
  secp256k1_scalar local_58;
  
  bVar54 = 0;
  local_58.d[0] = s1->d[0];
  local_58.d[1] = s1->d[1];
  local_58.d[2] = s1->d[2];
  local_58.d[3] = s1->d[3];
  secp256k1_scalar_split_lambda(s1,s2,&local_58);
  psVar50 = p1;
  psVar51 = p2;
  for (lVar44 = 0xb; lVar44 != 0; lVar44 = lVar44 + -1) {
    (psVar51->x).n[0] = (psVar50->x).n[0];
    psVar50 = (secp256k1_ge *)((long)psVar50 + (ulong)bVar54 * -0x10 + 8);
    psVar51 = (secp256k1_ge *)((long)psVar51 + (ulong)bVar54 * -0x10 + 8);
  }
  uVar47 = (p2->x).n[0];
  uVar53 = (p2->x).n[1];
  uVar1 = (p2->x).n[2];
  uVar2 = (p2->x).n[3];
  uVar3 = (p2->x).n[4];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar53;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar47;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar3;
  uVar43 = SUB168(ZEXT816(0x7ae96a2b657c) * auVar13,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar43 & 0xfffffffffffff;
  auVar4 = ZEXT816(0x7512f58995c13) * auVar10 + ZEXT816(0x96c28719501ee) * auVar9 +
           ZEXT816(0xc3434e99cf049) * auVar11 + ZEXT816(0x7106e64479ea) * auVar12 +
           auVar4 * ZEXT816(0x1000003d10);
  uVar45 = auVar4._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar45 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar3;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar53;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar47;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar43 >> 0x34 | SUB168(ZEXT816(0x7ae96a2b657c) * auVar13,8) << 0xc;
  auVar4 = ZEXT816(0x96c28719501ee) * auVar14 + auVar35 + ZEXT816(0x7512f58995c13) * auVar15 +
           ZEXT816(0xc3434e99cf049) * auVar16 + ZEXT816(0x7106e64479ea) * auVar17 +
           ZEXT816(0x7ae96a2b657c) * auVar18 + auVar5 * ZEXT816(0x1000003d10);
  uVar43 = auVar4._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar43 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar47;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar3;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar53;
  auVar4 = ZEXT816(0x7512f58995c13) * auVar20 + auVar36 + ZEXT816(0xc3434e99cf049) * auVar21 +
           ZEXT816(0x7106e64479ea) * auVar22 + ZEXT816(0x7ae96a2b657c) * auVar23;
  uVar46 = auVar4._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar46 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (uVar46 & 0xfffffffffffff) << 4 | (uVar43 & 0xfffffffffffff) >> 0x30;
  auVar4 = ZEXT816(0x96c28719501ee) * auVar19 + ZEXT816(0x1000003d1) * auVar24;
  uVar46 = auVar4._0_8_;
  (p2->x).n[0] = uVar46 & 0xfffffffffffff;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar46 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar53;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar47;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar3;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar1;
  auVar5 = ZEXT816(0xc3434e99cf049) * auVar27 + auVar38 + ZEXT816(0x7106e64479ea) * auVar28 +
           ZEXT816(0x7ae96a2b657c) * auVar29;
  uVar46 = auVar5._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar46 & 0xfffffffffffff;
  auVar4 = ZEXT816(0x96c28719501ee) * auVar25 + auVar37 + ZEXT816(0x7512f58995c13) * auVar26 +
           auVar6 * ZEXT816(0x1000003d10);
  uVar52 = auVar4._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar46 >> 0x34 | auVar5._8_8_ << 0xc;
  (p2->x).n[1] = uVar52 & 0xfffffffffffff;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar52 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar53;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar47;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar3;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar2;
  auVar5 = ZEXT816(0x7106e64479ea) * auVar33 + auVar40 + ZEXT816(0x7ae96a2b657c) * auVar34;
  uVar47 = auVar5._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar47 & 0xfffffffffffff;
  auVar4 = ZEXT816(0x96c28719501ee) * auVar30 + auVar39 + ZEXT816(0x7512f58995c13) * auVar31 +
           ZEXT816(0xc3434e99cf049) * auVar32 + auVar7 * ZEXT816(0x1000003d10);
  uVar53 = auVar4._0_8_;
  (p2->x).n[2] = uVar53 & 0xfffffffffffff;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = (uVar53 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar45 & 0xfffffffffffff);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar47 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar41 = auVar8 * ZEXT816(0x1000003d10) + auVar41;
  uVar47 = auVar41._0_8_;
  (p2->x).n[3] = uVar47 & 0xfffffffffffff;
  (p2->x).n[4] = (uVar47 >> 0x34 | auVar41._8_8_ << 0xc) + (uVar43 & 0xffffffffffff);
  uVar42 = -(int)((long)s1->d[3] >> 0x3f);
  uVar48 = uVar42 ^ 1;
  uVar49 = uVar48;
  if (s1->d[2] == 0xffffffffffffffff) {
    uVar49 = 0;
  }
  if (0x5d576e7357a4501c < s1->d[1]) {
    uVar48 = 0;
  }
  uVar48 = (uVar48 | uVar49 | s1->d[3] < 0x7fffffffffffffff) ^ 1;
  uVar49 = 0;
  if (0xdfe92f46681b20a0 < s1->d[0]) {
    uVar49 = uVar48;
  }
  if (0x5d576e7357a4501d < s1->d[1]) {
    uVar49 = uVar48;
  }
  if (uVar49 != 0 || uVar42 != 0) {
    secp256k1_scalar_negate(s1,s1);
    secp256k1_ge_neg(p1,p1);
  }
  uVar42 = -(int)((long)s2->d[3] >> 0x3f);
  uVar48 = uVar42 ^ 1;
  uVar49 = uVar48;
  if (s2->d[2] == 0xffffffffffffffff) {
    uVar49 = 0;
  }
  if (0x5d576e7357a4501c < s2->d[1]) {
    uVar48 = 0;
  }
  uVar48 = (uVar48 | uVar49 | s2->d[3] < 0x7fffffffffffffff) ^ 1;
  uVar49 = 0;
  if (0xdfe92f46681b20a0 < s2->d[0]) {
    uVar49 = uVar48;
  }
  if (0x5d576e7357a4501d < s2->d[1]) {
    uVar49 = uVar48;
  }
  if (uVar49 != 0 || uVar42 != 0) {
    secp256k1_scalar_negate(s2,s2);
    secp256k1_ge_neg(p2,p2);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_endo_split(secp256k1_scalar *s1, secp256k1_scalar *s2, secp256k1_ge *p1, secp256k1_ge *p2) {
    secp256k1_scalar tmp = *s1;
    secp256k1_scalar_split_lambda(s1, s2, &tmp);
    secp256k1_ge_mul_lambda(p2, p1);

    if (secp256k1_scalar_is_high(s1)) {
        secp256k1_scalar_negate(s1, s1);
        secp256k1_ge_neg(p1, p1);
    }
    if (secp256k1_scalar_is_high(s2)) {
        secp256k1_scalar_negate(s2, s2);
        secp256k1_ge_neg(p2, p2);
    }
}